

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O0

void * array_realloc(void *ptr,fastObjUInt n,fastObjUInt b)

{
  uint uVar1;
  int *piVar2;
  void *local_48;
  int local_40;
  int local_3c;
  fastObjUInt *r;
  fastObjUInt ncap;
  fastObjUInt cap;
  fastObjUInt nsz;
  fastObjUInt sz;
  fastObjUInt b_local;
  fastObjUInt n_local;
  void *ptr_local;
  
  if (ptr == (void *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = *(int *)((long)ptr + -8);
  }
  if (ptr == (void *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = *(int *)((long)ptr + -4);
  }
  r._0_4_ = (uint)(local_40 * 3) >> 1;
  if ((uint)r < local_3c + n) {
    r._0_4_ = local_3c + n;
  }
  uVar1 = (uint)r + 0xf & 0xfffffff0;
  if (ptr == (void *)0x0) {
    local_48 = (void *)0x0;
  }
  else {
    local_48 = (void *)((long)ptr + -8);
  }
  piVar2 = (int *)memory_realloc(local_48,(ulong)(b * uVar1) + 8);
  if (piVar2 == (int *)0x0) {
    ptr_local = (void *)0x0;
  }
  else {
    *piVar2 = local_3c;
    piVar2[1] = uVar1;
    ptr_local = piVar2 + 2;
  }
  return ptr_local;
}

Assistant:

static void* array_realloc(void* ptr, fastObjUInt n, fastObjUInt b)
{
   fastObjUInt sz = array_size(ptr);
   fastObjUInt nsz = sz + n;
   fastObjUInt cap = array_capacity(ptr);
   fastObjUInt ncap = 3 * cap / 2;
   fastObjUInt* r;


   if (ncap < nsz)
       ncap = nsz;
   ncap = (ncap + 15) & ~15u;

   r = (fastObjUInt*)(memory_realloc(ptr ? _array_header(ptr) : 0, b * ncap + 2 * sizeof(fastObjUInt)));
   if (!r)
       return 0;

   r[0] = sz;
   r[1] = ncap;

   return (r + 2);
}